

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall aeron::archive::AeronArchive::checkForErrorResponse(AeronArchive *this)

{
  bool bVar1;
  int iVar2;
  Value VVar3;
  int64_t iVar4;
  SourcedException *this_00;
  string *__rhs;
  long *plVar5;
  char *pcVar6;
  int in_ECX;
  size_type *psVar7;
  nfds_t __nfds;
  pollfd *in_RSI;
  unique_lock<std::mutex> lock;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  unique_lock<std::mutex> local_d8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_d8._M_device = &this->lock_;
  local_d8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_d8);
  local_d8._M_owns = true;
  iVar2 = ControlResponsePoller::poll
                    ((this->controlResponsePoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                     _M_head_impl,in_RSI,__nfds,in_ECX);
  if (iVar2 != 0) {
    bVar1 = ControlResponsePoller::isPollComplete
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (bVar1) {
      iVar4 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar4 == this->controlSessionId_) {
        iVar4 = ControlResponsePoller::templateId
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        if (iVar4 == 1) {
          VVar3 = ControlResponsePoller::code
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          if (VVar3 == ERROR) {
            this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
            __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                              ((this->controlResponsePoller_)._M_t.
                               super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               .
                               super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                               ._M_head_impl);
            std::operator+(&local_68,"error: ",__rhs);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
            local_f8._M_dataplus._M_p = (pointer)*plVar5;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((size_type *)local_f8._M_dataplus._M_p == psVar7) {
              local_f8.field_2._M_allocated_capacity = *psVar7;
              local_f8.field_2._8_8_ = plVar5[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar7;
            }
            local_f8._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            iVar4 = ControlResponsePoller::relevantId
                              ((this->controlResponsePoller_)._M_t.
                               super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                               .
                               super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                               ._M_head_impl);
            std::__cxx11::to_string(&local_88,iVar4);
            std::operator+(&local_48,&local_f8,&local_88);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,
                       "void aeron::archive::AeronArchive::checkForErrorResponse()","");
            pcVar6 = aeron::util::past_prefix
                               ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                               );
            std::__cxx11::string::string((string *)&local_a8,pcVar6,&local_f9);
            aeron::util::SourcedException::SourcedException
                      (this_00,&local_48,&local_c8,&local_a8,0x73);
            *(undefined ***)this_00 = &PTR__SourcedException_00162228;
            __cxa_throw(this_00,&ArchiveException::typeinfo,
                        aeron::util::SourcedException::~SourcedException);
          }
        }
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_d8);
  return;
}

Assistant:

void AeronArchive::checkForErrorResponse() {
    std::unique_lock<std::mutex> lock(lock_);

    if (controlResponsePoller_->poll() != 0 && controlResponsePoller_->isPollComplete()) {
        if (controlResponsePoller_->controlSessionId() == controlSessionId_ &&
            controlResponsePoller_->templateId() == codecs::ControlResponse::sbeTemplateId() &&
            controlResponsePoller_->code() == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        }
    }
}